

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_84,_288>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  Scalar SVar1;
  Scalar *pSVar2;
  
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x54] = SVar1;
  pSVar2[0x55] = SVar1;
  pSVar2[0x56] = SVar1;
  pSVar2[0x57] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x58] = SVar1;
  pSVar2[0x59] = SVar1;
  pSVar2[0x5a] = SVar1;
  pSVar2[0x5b] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x5c] = SVar1;
  pSVar2[0x5d] = SVar1;
  pSVar2[0x5e] = SVar1;
  pSVar2[0x5f] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x60] = SVar1;
  pSVar2[0x61] = SVar1;
  pSVar2[0x62] = SVar1;
  pSVar2[99] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[100] = SVar1;
  pSVar2[0x65] = SVar1;
  pSVar2[0x66] = SVar1;
  pSVar2[0x67] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x68] = SVar1;
  pSVar2[0x69] = SVar1;
  pSVar2[0x6a] = SVar1;
  pSVar2[0x6b] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x6c] = SVar1;
  pSVar2[0x6d] = SVar1;
  pSVar2[0x6e] = SVar1;
  pSVar2[0x6f] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x70] = SVar1;
  pSVar2[0x71] = SVar1;
  pSVar2[0x72] = SVar1;
  pSVar2[0x73] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x74] = SVar1;
  pSVar2[0x75] = SVar1;
  pSVar2[0x76] = SVar1;
  pSVar2[0x77] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x78] = SVar1;
  pSVar2[0x79] = SVar1;
  pSVar2[0x7a] = SVar1;
  pSVar2[0x7b] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x7c] = SVar1;
  pSVar2[0x7d] = SVar1;
  pSVar2[0x7e] = SVar1;
  pSVar2[0x7f] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x80] = SVar1;
  pSVar2[0x81] = SVar1;
  pSVar2[0x82] = SVar1;
  pSVar2[0x83] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x84] = SVar1;
  pSVar2[0x85] = SVar1;
  pSVar2[0x86] = SVar1;
  pSVar2[0x87] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x88] = SVar1;
  pSVar2[0x89] = SVar1;
  pSVar2[0x8a] = SVar1;
  pSVar2[0x8b] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x8c] = SVar1;
  pSVar2[0x8d] = SVar1;
  pSVar2[0x8e] = SVar1;
  pSVar2[0x8f] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x90] = SVar1;
  pSVar2[0x91] = SVar1;
  pSVar2[0x92] = SVar1;
  pSVar2[0x93] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x94] = SVar1;
  pSVar2[0x95] = SVar1;
  pSVar2[0x96] = SVar1;
  pSVar2[0x97] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x98] = SVar1;
  pSVar2[0x99] = SVar1;
  pSVar2[0x9a] = SVar1;
  pSVar2[0x9b] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0x9c] = SVar1;
  pSVar2[0x9d] = SVar1;
  pSVar2[0x9e] = SVar1;
  pSVar2[0x9f] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xa0] = SVar1;
  pSVar2[0xa1] = SVar1;
  pSVar2[0xa2] = SVar1;
  pSVar2[0xa3] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xa4] = SVar1;
  pSVar2[0xa5] = SVar1;
  pSVar2[0xa6] = SVar1;
  pSVar2[0xa7] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xa8] = SVar1;
  pSVar2[0xa9] = SVar1;
  pSVar2[0xaa] = SVar1;
  pSVar2[0xab] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xac] = SVar1;
  pSVar2[0xad] = SVar1;
  pSVar2[0xae] = SVar1;
  pSVar2[0xaf] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xb0] = SVar1;
  pSVar2[0xb1] = SVar1;
  pSVar2[0xb2] = SVar1;
  pSVar2[0xb3] = SVar1;
  pSVar2 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>_>).
           m_data;
  SVar1 = (kernel->m_src->m_functor).m_other;
  pSVar2[0xb4] = SVar1;
  pSVar2[0xb5] = SVar1;
  pSVar2[0xb6] = SVar1;
  pSVar2[0xb7] = SVar1;
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_24,_12,_0,_24,_12>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_184,_288>
  ::run(kernel);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void assignPacket(Index row, Index col)
  {
    m_functor.template assignPacket<StoreMode>(&m_dst.coeffRef(row,col), m_src.template packet<LoadMode,PacketType>(row,col));
  }